

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_tree.cc
# Opt level: O1

bool __thiscall
IndexTree::_insert(IndexTree *this,int32_t *root,int32_t new_node,int *balance_change)

{
  Node *__s2;
  Node *__s1;
  Node *pNVar1;
  int32_t iVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  short sVar7;
  
  lVar6 = (long)*root;
  if (lVar6 == -1) {
    *root = new_node;
    *balance_change = 1;
  }
  else {
    pNVar1 = this->nodes;
    __s2 = pNVar1 + lVar6;
    __s1 = pNVar1 + new_node;
    *balance_change = 0;
    if (*(long *)pNVar1[new_node].key == *(long *)pNVar1[lVar6].key) {
      iVar4 = strcmp(__s1->key,__s2->key);
      uVar5 = 0xffffffff;
      if (-1 < iVar4) {
        uVar5 = (uint)(iVar4 != 0);
      }
    }
    else {
      uVar5 = (uint)(*(long *)pNVar1[lVar6].key <= *(long *)pNVar1[new_node].key) * 2 - 1;
    }
    if (uVar5 == 0) {
      *root = new_node;
      iVar2 = __s2->right;
      __s1->left = __s2->left;
      __s1->right = iVar2;
      __s1->balance_factor = __s2->balance_factor;
      return true;
    }
    bVar3 = _insert(this,&__s2->left + (uVar5 != 0xffffffff),new_node,balance_change);
    if (bVar3) {
      return true;
    }
    iVar4 = *balance_change;
    sVar7 = (short)uVar5 * (short)iVar4 + __s2->balance_factor;
    __s2->balance_factor = sVar7;
    uVar5 = 0;
    if ((iVar4 != 0) && (sVar7 != 0)) {
      uVar5 = balance(this,root);
      uVar5 = uVar5 ^ 1;
    }
    *balance_change = uVar5;
  }
  return false;
}

Assistant:

bool IndexTree::_insert(int32_t &root, int32_t new_node, int &balance_change) {

    if (root == -1) {
        root = new_node;
        balance_change = 1;
        return false;
    }

    auto &_root = nodes[root];
    auto &_new = nodes[new_node];
    balance_change = 0;
    int height_increase = 0;

//    printf("Insert querying: %d left %d right %d key %s\n", root, _root.left, _root.right, _root.key);

    auto result = fast_string_cmp(_new.key, _root.key);

    if (__glibc_likely(result != 0)) {
        auto &sub_tree_id = result == -1 ? _root.left : _root.right;
        if (_insert(sub_tree_id, new_node, balance_change)) {
            return true;
        }
        height_increase = result * balance_change;
    } else {
        // found existing node, replace it
        root = new_node;
        _new.left = _root.left;
        _new.right = _root.right;
        _new.balance_factor = _root.balance_factor;
        return true;
    }

    _root.balance_factor += height_increase;

    if (height_increase != 0 && _root.balance_factor != 0) {
        balance_change = 1 - balance(root);
    } else {
        balance_change = 0;
    }

    return false;

}